

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.h
# Opt level: O0

size_t sdsavail(sds s)

{
  sdshdr64 *sh_3;
  sdshdr32 *sh_2;
  sdshdr16 *sh_1;
  sdshdr8 *sh;
  uchar flags;
  sds s_local;
  
  switch(s[-1] & 7) {
  case 0:
    s_local = (sds)0x0;
    break;
  case 1:
    s_local = (sds)(long)(int)((uint)(byte)s[-2] - (uint)(byte)s[-3]);
    break;
  case 2:
    s_local = (sds)(long)(int)((uint)*(ushort *)(s + -3) - (uint)*(ushort *)(s + -5));
    break;
  case 3:
    s_local = (sds)(ulong)(uint)(*(int *)(s + -5) - *(int *)(s + -9));
    break;
  case 4:
    s_local = (sds)(*(long *)(s + -9) - *(long *)(s + -0x11));
    break;
  default:
    s_local = (sds)0x0;
  }
  return (size_t)s_local;
}

Assistant:

static inline size_t sdsavail(const sds s) {
    unsigned char flags = s[-1];
    switch(flags&SDS_TYPE_MASK) {
        case SDS_TYPE_5: {
            return 0;
        }
        case SDS_TYPE_8: {
            SDS_HDR_VAR(8,s);
            return sh->alloc - sh->len;
        }
        case SDS_TYPE_16: {
            SDS_HDR_VAR(16,s);
            return sh->alloc - sh->len;
        }
        case SDS_TYPE_32: {
            SDS_HDR_VAR(32,s);
            return sh->alloc - sh->len;
        }
        case SDS_TYPE_64: {
            SDS_HDR_VAR(64,s);
            return sh->alloc - sh->len;
        }
    }
    return 0;
}